

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O1

void __thiscall
el::base::TypedConfigurations::insertFile
          (TypedConfigurations *this,Level level,string *fullFilename)

{
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<std::fstream>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<std::fstream>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *p_Var1;
  char *__s;
  size_t sVar2;
  iterator iVar3;
  fstream_t *__p;
  mapped_type *pmVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  undefined4 in_register_00000034;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_1;
  string resolvedFilename;
  string filePath;
  Level local_bc;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **local_b8;
  fstream_t *local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a8;
  undefined1 local_a0 [8];
  element_type *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  string local_88;
  fstream_t *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_60 [2];
  string local_50;
  
  resolveFilename(&local_88,(TypedConfigurations *)CONCAT44(in_register_00000034,level),fullFilename
                 );
  if (local_88._M_string_length == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Could not load empty file for logging, please re-check your configurations for level ["
               ,0x56);
    __s = LevelHelper::convertToString(level);
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"]",1);
  }
  utils::File::extractPathFromFilename(&local_50,&local_88,"/");
  if (local_50._M_string_length < local_88._M_string_length) {
    utils::File::createPath(&local_50);
  }
  if ((this->m_fileStreamMap)._M_h._M_element_count == 0 &&
      (this->m_filenameMap)._M_h._M_element_count == 0) {
    level = Global;
  }
  local_bc = level;
  iVar3 = utils::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&this->m_logStreamsReference->_M_h,&local_88);
  if (iVar3.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    __p = utils::File::newFileStream(&local_88);
    local_b8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)CONCAT44(local_b8._4_4_,local_bc);
    local_b0 = (fstream_t *)local_a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,local_88._M_dataplus._M_p,
               local_88._M_dataplus._M_p + local_88._M_string_length);
    std::
    _Hashtable<el::Level,std::pair<el::Level_const,std::__cxx11::string>,std::allocator<std::pair<el::Level_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<el::Level>,std::hash<el::Level>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<el::Level,std::__cxx11::string>>
              ((_Hashtable<el::Level,std::pair<el::Level_const,std::__cxx11::string>,std::allocator<std::pair<el::Level_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<el::Level>,std::hash<el::Level>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&this->m_filenameMap,&local_b8);
    if (local_b0 != (fstream_t *)local_a0) {
      operator_delete(local_b0);
    }
    local_68 = __p;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<std::fstream*>(a_Stack_60,__p);
    local_b8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)CONCAT44(local_b8._4_4_,local_bc);
    local_b0 = local_68;
    p_Stack_a8 = a_Stack_60[0]._M_pi;
    local_68 = (fstream_t *)0x0;
    a_Stack_60[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::
    _Hashtable<el::Level,std::pair<el::Level_const,std::shared_ptr<std::fstream>>,std::allocator<std::pair<el::Level_const,std::shared_ptr<std::fstream>>>,std::__detail::_Select1st,std::equal_to<el::Level>,std::hash<el::Level>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<el::Level,std::shared_ptr<std::fstream>>>
              ((_Hashtable<el::Level,std::pair<el::Level_const,std::shared_ptr<std::fstream>>,std::allocator<std::pair<el::Level_const,std::shared_ptr<std::fstream>>>,std::__detail::_Select1st,std::equal_to<el::Level>,std::hash<el::Level>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&this->m_fileStreamMap);
    if (p_Stack_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a8);
    }
    if (a_Stack_60[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_60[0]._M_pi);
    }
    p_Var1 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<std::fstream>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<std::fstream>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)this->m_logStreamsReference;
    pmVar4 = utils::std::__detail::
             _Map_base<el::Level,_std::pair<const_el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<el::Level>,_std::hash<el::Level>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::at((_Map_base<el::Level,_std::pair<const_el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<const_el::Level,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<el::Level>,_std::hash<el::Level>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   *)&this->m_fileStreamMap,&local_bc);
    local_98 = (pmVar4->
               super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
    local_90 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               (pmVar4->
               super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
               )._M_refcount._M_pi;
    if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90)->_M_use_count + 1;
      }
    }
    local_b8 = &p_Stack_a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b8,local_88._M_dataplus._M_p,
               local_88._M_dataplus._M_p + local_88._M_string_length);
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<std::fstream>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<std::fstream>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<std::__cxx11::string,std::shared_ptr<std::fstream>>>(p_Var1);
    if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
    }
    if (local_b8 != &p_Stack_a8) {
      operator_delete(local_b8);
    }
  }
  else {
    local_b8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)CONCAT44(local_b8._4_4_,local_bc);
    local_b0 = (fstream_t *)local_a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,
               *(long *)((long)iVar3.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_true>
                               ._M_cur + 8),
               *(long *)((long)iVar3.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_true>
                               ._M_cur + 0x10) +
               *(long *)((long)iVar3.
                               super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_true>
                               ._M_cur + 8));
    std::
    _Hashtable<el::Level,std::pair<el::Level_const,std::__cxx11::string>,std::allocator<std::pair<el::Level_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<el::Level>,std::hash<el::Level>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<el::Level,std::__cxx11::string>>
              ((_Hashtable<el::Level,std::pair<el::Level_const,std::__cxx11::string>,std::allocator<std::pair<el::Level_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<el::Level>,std::hash<el::Level>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&this->m_filenameMap,&local_b8);
    if (local_b0 != (fstream_t *)local_a0) {
      operator_delete(local_b0);
    }
    local_b0 = *(fstream_t **)
                ((long)iVar3.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_true>
                       ._M_cur + 0x28);
    p_Stack_a8 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                  ((long)iVar3.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_true>
                         ._M_cur + 0x30);
    if (p_Stack_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Stack_a8->_M_use_count = p_Stack_a8->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Stack_a8->_M_use_count = p_Stack_a8->_M_use_count + 1;
      }
    }
    local_b8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)CONCAT44(local_b8._4_4_,local_bc);
    std::
    _Hashtable<el::Level,std::pair<el::Level_const,std::shared_ptr<std::fstream>>,std::allocator<std::pair<el::Level_const,std::shared_ptr<std::fstream>>>,std::__detail::_Select1st,std::equal_to<el::Level>,std::hash<el::Level>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<el::Level,std::shared_ptr<std::fstream>>>
              ((_Hashtable<el::Level,std::pair<el::Level_const,std::shared_ptr<std::fstream>>,std::allocator<std::pair<el::Level_const,std::shared_ptr<std::fstream>>>,std::__detail::_Select1st,std::equal_to<el::Level>,std::hash<el::Level>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&this->m_fileStreamMap);
    if (p_Stack_a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_a8);
    }
    __p = *(fstream_t **)
           ((long)iVar3.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_true>
                  ._M_cur + 0x28);
  }
  if (__p == (fstream_t *)0x0) {
    local_b8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
               ((ulong)local_b8 & 0xffffffffffffff00);
    setValue<bool>(this,local_bc,(bool *)&local_b8,&this->m_toFileMap,true);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  return;
}

Assistant:

void TypedConfigurations::insertFile(Level level, const std::string& fullFilename) {
  std::string resolvedFilename = resolveFilename(fullFilename);
  if (resolvedFilename.empty()) {
    std::cerr << "Could not load empty file for logging, please re-check your configurations for level ["
              << LevelHelper::convertToString(level) << "]";
  }
  std::string filePath = base::utils::File::extractPathFromFilename(resolvedFilename, base::consts::kFilePathSeperator);
  if (filePath.size() < resolvedFilename.size()) {
    base::utils::File::createPath(filePath);
  }
  auto create = [&](Level level) {
    base::LogStreamsReferenceMap::iterator filestreamIter = m_logStreamsReference->find(resolvedFilename);
    base::type::fstream_t* fs = nullptr;
    if (filestreamIter == m_logStreamsReference->end()) {
      // We need a completely new stream, nothing to share with
      fs = base::utils::File::newFileStream(resolvedFilename);
      m_filenameMap.insert(std::make_pair(level, resolvedFilename));
      m_fileStreamMap.insert(std::make_pair(level, base::FileStreamPtr(fs)));
      m_logStreamsReference->insert(std::make_pair(resolvedFilename, base::FileStreamPtr(m_fileStreamMap.at(level))));
    } else {
      // Woops! we have an existing one, share it!
      m_filenameMap.insert(std::make_pair(level, filestreamIter->first));
      m_fileStreamMap.insert(std::make_pair(level, base::FileStreamPtr(filestreamIter->second)));
      fs = filestreamIter->second.get();
    }
    if (fs == nullptr) {
      // We display bad file error from newFileStream()
      ELPP_INTERNAL_ERROR("Setting [TO_FILE] of ["
                          << LevelHelper::convertToString(level) << "] to FALSE", false);
      setValue(level, false, &m_toFileMap);
    }
  };
  // If we dont have file conf for any level, create it for Level::Global first
  // otherwise create for specified level
  create(m_filenameMap.empty() && m_fileStreamMap.empty() ? Level::Global : level);
}